

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC2544(CNetAddr *this)

{
  long lVar1;
  bool bVar2;
  uchar *puVar3;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  size_type pos;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar4;
  undefined1 uVar5;
  
  pos = (size_type)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsIPv4((CNetAddr *)
                 CONCAT17(in_stack_ffffffffffffffdf,
                          CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
  bVar4 = false;
  if (bVar2) {
    puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                        (ulong)in_stack_ffffffffffffffe8,pos);
    uVar5 = false;
    bVar4 = (bool)uVar5;
    if (*puVar3 == 0xc6) {
      puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                          (ulong)in_stack_ffffffffffffffe8,pos);
      bVar4 = true;
      if (*puVar3 != '\x12') {
        puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(uVar5,in_stack_ffffffffffffffe8),pos);
        bVar4 = *puVar3 == '\x13';
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::IsRFC2544() const
{
    return IsIPv4() && m_addr[0] == 198 && (m_addr[1] == 18 || m_addr[1] == 19);
}